

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutPool.h
# Opt level: O2

void __thiscall HighsCutPool::resetAge(HighsCutPool *this,HighsInt cut)

{
  int *piVar1;
  pointer psVar2;
  short sVar3;
  HighsInt local_24;
  key_type local_20;
  
  psVar2 = (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar3 = psVar2[cut];
  local_20.first = (int)sVar3;
  if (0 < sVar3) {
    local_24 = cut;
    if ((this->matrix_).colsLinked.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start[cut] != '\0') {
      local_20.second = cut;
      std::
      _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
      ::erase(&(this->propRows)._M_t,&local_20);
      local_20.first = 0;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
      ::_M_emplace_unique<int,int&>
                ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                  *)&this->propRows,&local_20.first,&local_24);
      psVar2 = (this->ages_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar3 = psVar2[local_24];
    }
    piVar1 = (this->ageDistribution).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1[sVar3] = piVar1[sVar3] + -1;
    *piVar1 = *piVar1 + 1;
    psVar2[local_24] = 0;
  }
  return;
}

Assistant:

void resetAge(HighsInt cut) {
    if (ages_[cut] > 0) {
      if (matrix_.columnsLinked(cut)) {
        propRows.erase(std::make_pair(ages_[cut], cut));
        propRows.emplace(0, cut);
      }
      ageDistribution[ages_[cut]] -= 1;
      ageDistribution[0] += 1;
      ages_[cut] = 0;
    }
  }